

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

string * hash_V5(string *__return_storage_ptr__,string *password,string *salt,string *udata,
                EncryptionData *data)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uchar *iv;
  byte *pbVar5;
  int local_234;
  string local_208 [36];
  int local_1e4;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  uint local_1d4;
  undefined1 local_1d0 [4];
  uint ch;
  undefined1 local_1b0 [8];
  Pl_SHA2 sha2;
  uint local_160;
  int next_hash;
  uint i;
  int E_mod_3;
  string local_138;
  undefined1 local_118 [8];
  string E;
  undefined1 local_d8 [8];
  string K1;
  int local_b0;
  bool done;
  int round_number;
  string K;
  undefined1 local_78 [8];
  Pl_SHA2 hash;
  EncryptionData *data_local;
  string *udata_local;
  string *salt_local;
  string *password_local;
  string *result;
  
  hash.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)data;
  Pl_SHA2::Pl_SHA2((Pl_SHA2 *)local_78,0x100,(Pipeline *)0x0);
  Pipeline::writeString((Pipeline *)local_78,password);
  Pipeline::writeString((Pipeline *)local_78,salt);
  Pipeline::writeString((Pipeline *)local_78,udata);
  Pl_SHA2::finish((Pl_SHA2 *)local_78);
  Pl_SHA2::getRawDigest_abi_cxx11_((string *)&round_number,(Pl_SHA2 *)local_78);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  iVar2 = QPDF::EncryptionData::getR
                    ((EncryptionData *)
                     hash.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  if (iVar2 < 6) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&round_number);
  }
  else {
    local_b0 = 0;
    K1.field_2._M_local_buf[0xf] = '\0';
    while (((K1.field_2._M_local_buf[0xf] ^ 0xffU) & 1) != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&E.field_2 + 8),password,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &round_number);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&E.field_2 + 8),udata);
      std::__cxx11::string::~string((string *)(E.field_2._M_local_buf + 8));
      uVar4 = std::__cxx11::string::length();
      if (uVar4 < 0x20) {
        __assert_fail("K.length() >= 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDF_encryption.cc"
                      ,0x114,
                      "std::string hash_V5(const std::string &, const std::string &, const std::string &, const QPDF::EncryptionData &)"
                     );
      }
      std::__cxx11::string::substr((ulong)&local_138,(ulong)&round_number);
      std::__cxx11::string::substr((ulong)&i,(ulong)&round_number);
      iv = QUtil::unsigned_char_pointer((string *)&i);
      process_with_aes((string *)local_118,&local_138,true,(string *)local_d8,0,0x40,iv,0x10);
      std::__cxx11::string::~string((string *)&i);
      std::__cxx11::string::~string((string *)&local_138);
      next_hash = 0;
      for (local_160 = 0; local_160 < 0x10; local_160 = local_160 + 1) {
        pbVar5 = (byte *)std::__cxx11::string::at((ulong)local_118);
        next_hash = (uint)*pbVar5 + next_hash;
      }
      if (next_hash % 3 == 0) {
        local_234 = 0x100;
      }
      else {
        local_234 = 0x200;
        if (next_hash % 3 == 1) {
          local_234 = 0x180;
        }
      }
      sha2.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ = local_234;
      Pl_SHA2::Pl_SHA2((Pl_SHA2 *)local_1b0,local_234,(Pipeline *)0x0);
      Pipeline::writeString((Pipeline *)local_1b0,(string *)local_118);
      Pl_SHA2::finish((Pl_SHA2 *)local_1b0);
      Pl_SHA2::getRawDigest_abi_cxx11_((string *)local_1d0,(Pl_SHA2 *)local_1b0);
      std::__cxx11::string::operator=((string *)&round_number,(string *)local_1d0);
      std::__cxx11::string::~string((string *)local_1d0);
      if (0x3f < local_b0 + 1) {
        std::__cxx11::string::rbegin();
        pbVar5 = (byte *)std::
                         reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator*(&local_1e0);
        bVar1 = *pbVar5;
        local_1e4 = local_b0 + -0x1f;
        local_1d4 = (uint)bVar1;
        uVar3 = QIntC::to_uint<int>(&local_1e4);
        if (bVar1 <= uVar3) {
          K1.field_2._M_local_buf[0xf] = '\x01';
        }
      }
      Pl_SHA2::~Pl_SHA2((Pl_SHA2 *)local_1b0);
      std::__cxx11::string::~string((string *)local_118);
      std::__cxx11::string::~string((string *)local_d8);
      local_b0 = local_b0 + 1;
    }
    std::__cxx11::string::substr((ulong)local_208,(ulong)&round_number);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_208);
    std::__cxx11::string::~string(local_208);
  }
  std::__cxx11::string::~string((string *)&round_number);
  Pl_SHA2::~Pl_SHA2((Pl_SHA2 *)local_78);
  return __return_storage_ptr__;
}

Assistant:

static std::string
hash_V5(
    std::string const& password,
    std::string const& salt,
    std::string const& udata,
    QPDF::EncryptionData const& data)
{
    Pl_SHA2 hash(256);
    hash.writeString(password);
    hash.writeString(salt);
    hash.writeString(udata);
    hash.finish();
    std::string K = hash.getRawDigest();

    std::string result;
    if (data.getR() < 6) {
        result = K;
    } else {
        // Algorithm 2.B from ISO 32000-1 chapter 7: Computing a hash

        int round_number = 0;
        bool done = false;
        while (!done) {
            // The hash algorithm has us setting K initially to the R5 value and then repeating a
            // series of steps 64 times before starting with the termination case testing.  The
            // wording of the specification is very unclear as to the exact number of times it
            // should be run since the wording about whether the initial setup counts as round 0 or
            // not is ambiguous.  This code counts the initial setup (R5) value as round 0, which
            // appears to be correct.  This was determined to be correct by increasing or decreasing
            // the number of rounds by 1 or 2 from this value and generating 20 test files.  In this
            // interpretation, all the test files worked with Adobe Reader X.  In the other
            // configurations, many of the files did not work, and we were accurately able to
            // predict which files didn't work by looking at the conditions under which we
            // terminated repetition.

            ++round_number;
            std::string K1 = password + K + udata;
            qpdf_assert_debug(K.length() >= 32);
            std::string E = process_with_aes(
                K.substr(0, 16),
                true,
                K1,
                0,
                64,
                QUtil::unsigned_char_pointer(K.substr(16, 16)),
                16);

            // E_mod_3 is supposed to be mod 3 of the first 16 bytes of E taken as as a (128-bit)
            // big-endian number.  Since (xy mod n) is equal to ((x mod n) + (y mod n)) mod n and
            // since 256 mod n is 1, we can just take the sums of the the mod 3s of each byte to get
            // the same result.
            int E_mod_3 = 0;
            for (unsigned int i = 0; i < 16; ++i) {
                E_mod_3 += static_cast<unsigned char>(E.at(i));
            }
            E_mod_3 %= 3;
            int next_hash = ((E_mod_3 == 0) ? 256 : (E_mod_3 == 1) ? 384 : 512);
            Pl_SHA2 sha2(next_hash);
            sha2.writeString(E);
            sha2.finish();
            K = sha2.getRawDigest();

            if (round_number >= 64) {
                unsigned int ch = static_cast<unsigned char>(*(E.rbegin()));

                if (ch <= QIntC::to_uint(round_number - 32)) {
                    done = true;
                }
            }
        }
        result = K.substr(0, 32);
    }

    return result;
}